

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O2

ngx_int_t ngx_parse_addr_port(ngx_pool_t *pool,ngx_addr_t *addr,u_char *text,size_t len)

{
  u_char *last;
  ngx_int_t nVar1;
  u_char *puVar2;
  ngx_int_t nVar3;
  ulong n;
  
  nVar1 = ngx_parse_addr(pool,addr,text,len);
  if (nVar1 == -5) {
    last = text + len;
    nVar1 = -5;
    if ((len == 0) || (*text != '[')) {
      puVar2 = ngx_strlchr(text,last,':');
      if (puVar2 == (u_char *)0x0) {
        return -5;
      }
    }
    else {
      puVar2 = ngx_strlchr(text,last,']');
      if (puVar2 == last + -1 || puVar2 == (u_char *)0x0) {
        return -5;
      }
      if (puVar2[1] != ':') {
        return -5;
      }
      puVar2 = puVar2 + 1;
      text = text + 1;
      len = len - 2;
    }
    n = (long)last - (long)(puVar2 + 1);
    nVar3 = ngx_atoi(puVar2 + 1,n);
    if ((0xffffffffffff0000 < nVar3 - 0x10000U) &&
       (nVar1 = ngx_parse_addr(pool,addr,text,len + ~n), nVar1 == 0)) {
      if (addr->sockaddr->sa_family != 1) {
        *(ushort *)addr->sockaddr->sa_data = (ushort)nVar3 << 8 | (ushort)nVar3 >> 8;
      }
      nVar1 = 0;
    }
  }
  return nVar1;
}

Assistant:

ngx_int_t
ngx_parse_addr_port(ngx_pool_t *pool, ngx_addr_t *addr, u_char *text,
    size_t len)
{
    u_char     *p, *last;
    size_t      plen;
    ngx_int_t   rc, port;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_DECLINED) {
        return rc;
    }

    last = text + len;

#if (NGX_HAVE_INET6)
    if (len && text[0] == '[') {

        p = ngx_strlchr(text, last, ']');

        if (p == NULL || p == last - 1 || *++p != ':') {
            return NGX_DECLINED;
        }

        text++;
        len -= 2;

    } else
#endif

    {
        p = ngx_strlchr(text, last, ':');

        if (p == NULL) {
            return NGX_DECLINED;
        }
    }

    p++;
    plen = last - p;

    port = ngx_atoi(p, plen);

    if (port < 1 || port > 65535) {
        return NGX_DECLINED;
    }

    len -= plen + 1;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_inet_set_port(addr->sockaddr, (in_port_t) port);

    return NGX_OK;
}